

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O3

int re_searchagain(int f,int n)

{
  int iVar1;
  
  if (re_srch_lastdir == -1) {
    iVar1 = re_forwsrch();
  }
  else {
    if (re_srch_lastdir != -2) {
      if (re_srch_lastdir != -3) {
        return 1;
      }
      dobeep();
      ewprintf("No last search");
      return 0;
    }
    iVar1 = re_backsrch();
  }
  if (iVar1 == 0) {
    dobeep();
    ewprintf("Search failed: \"%s\"",re_pat);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int
re_searchagain(int f, int n)
{
	if (re_srch_lastdir == SRCH_NOPR) {
		dobeep();
		ewprintf("No last search");
		return (FALSE);
	}
	if (re_srch_lastdir == SRCH_FORW) {
		if (re_forwsrch() == FALSE) {
			dobeep();
			ewprintf("Search failed: \"%s\"", re_pat);
			return (FALSE);
		}
		return (TRUE);
	}
	if (re_srch_lastdir == SRCH_BACK)
		if (re_backsrch() == FALSE) {
			dobeep();
			ewprintf("Search failed: \"%s\"", re_pat);
			return (FALSE);
		}

	return (TRUE);
}